

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wabtapi.cc
# Opt level: O0

void write_invalid_module(Context *ctx,Var obj,ScriptModule *module,string *text)

{
  CreateBufferFn p_Var1;
  int iVar2;
  ScriptModuleType SVar3;
  uint uVar4;
  undefined4 extraout_var;
  TextScriptModule *pTVar5;
  DataScriptModule<(wabt::ScriptModuleType)1> *pDVar6;
  uchar *puVar7;
  size_type value;
  Var value_00;
  Var buffer;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *data;
  string *text_local;
  ScriptModule *module_local;
  Var obj_local;
  Context *ctx_local;
  
  iVar2 = (*module->_vptr_ScriptModule[2])();
  write_location(ctx,obj,(Location *)CONCAT44(extraout_var,iVar2));
  write_string(ctx,obj,10,text);
  SVar3 = wabt::ScriptModule::type(module);
  if (SVar3 == Text) {
    pTVar5 = wabt::cast<wabt::TextScriptModule,wabt::ScriptModule>(module);
    write_module(ctx,obj,&pTVar5->module,false);
  }
  else {
    if (SVar3 == Binary) {
      pDVar6 = wabt::cast<wabt::DataScriptModule<(wabt::ScriptModuleType)1>,wabt::ScriptModule>
                         (module);
    }
    else {
      if (SVar3 != Quoted) {
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/chakra/wabtapi.cc"
                      ,0x14e,
                      "void write_invalid_module(Context *, Js::Var, const ScriptModule *, const std::string &)"
                     );
      }
      pDVar6 = (DataScriptModule<(wabt::ScriptModuleType)1> *)
               wabt::cast<wabt::DataScriptModule<(wabt::ScriptModuleType)2>,wabt::ScriptModule>
                         (module);
    }
    buffer = &pDVar6->data;
    p_Var1 = ctx->chakra->createBuffer;
    puVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)buffer);
    value = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)buffer);
    uVar4 = TruncSizeT(value);
    value_00 = (*p_Var1)(puVar7,uVar4,ctx->chakra->user_data);
    set_property(ctx,obj,3,value_00,"Unable to set invalid module");
  }
  return;
}

Assistant:

static void write_invalid_module(Context* ctx, Js::Var obj, const ScriptModule* module, const std::string& text)
{
    write_location(ctx, obj, &module->location());
    write_string(ctx, obj, PropertyIds::text, text);
    const std::vector<uint8_t>* data = nullptr;
    switch (module->type())
    {
    case ScriptModuleType::Text:
        write_module(ctx, obj, &cast<TextScriptModule>(module)->module, false);
        break;
    case ScriptModuleType::Binary:
        data = &cast<BinaryScriptModule>(module)->data;
        goto create_binary_module;
    case ScriptModuleType::Quoted:
        data = &cast<QuotedScriptModule>(module)->data;
    create_binary_module:
        {
            Js::Var buffer = ctx->chakra->createBuffer(data->data(), TruncSizeT(data->size()), ctx->chakra->user_data);
            set_property(ctx, obj, PropertyIds::buffer, buffer, "Unable to set invalid module");
            break;
        }
    default:
        assert(false);
        break;
    }
}